

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MultiplyBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_multiplybroadcastable
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  MultiplyBroadcastableLayerParams *pMVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_multiplybroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_multiplybroadcastable(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pMVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::MultiplyBroadcastableLayerParams>(arena);
    (this->layer_).multiplybroadcastable_ = pMVar2;
  }
  return (MultiplyBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MultiplyBroadcastableLayerParams* NeuralNetworkLayer::_internal_mutable_multiplybroadcastable() {
  if (!_internal_has_multiplybroadcastable()) {
    clear_layer();
    set_has_multiplybroadcastable();
    layer_.multiplybroadcastable_ = CreateMaybeMessage< ::CoreML::Specification::MultiplyBroadcastableLayerParams >(GetArenaForAllocation());
  }
  return layer_.multiplybroadcastable_;
}